

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test::TestBody
          (GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test *this)

{
  Message *message;
  Metadata MVar1;
  TestAllExtensions from_message2;
  TestAllExtensions from_message1;
  ReflectionTester reflection_tester;
  Arena arena;
  TestAllExtensions local_190;
  TestAllExtensions local_160;
  ReflectionTester local_130;
  ThreadSafeArena local_b0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  message = (Message *)
            Arena::DefaultConstruct<proto2_unittest::TestAllExtensions>((Arena *)&local_b0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_160,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_190,(Arena *)0x0);
  MVar1 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  TestUtil::ReflectionTester::ReflectionTester(&local_130,MVar1.descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_130,&local_160.super_Message);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection(&local_130,&local_190.super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection(&local_130,message,IS_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&local_160.super_Message,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection(&local_130,message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            (&local_190.super_Message,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection(&local_130,message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToNullViaReflection
            (&local_130,message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection(&local_130,message,IS_NULL);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_190);
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_160);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SetAllocatedExtensionMessageOnArenaTest) {
  Arena arena;
  unittest::TestAllExtensions* to_message =
      Arena::Create<unittest::TestAllExtensions>(&arena);
  unittest::TestAllExtensions from_message1;
  unittest::TestAllExtensions from_message2;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());
  reflection_tester.SetAllFieldsViaReflection(&from_message1);
  reflection_tester.SetAllFieldsViaReflection(&from_message2);

  // Before moving fields, we expect the nested messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are moved we should get non-nullptr releases.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message1, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // Another move to make sure that we can SetAllocated several times.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message2, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // After SetAllocatedOptionalMessageFieldsToNullViaReflection() we expect the
  // releases to be nullptr again.
  reflection_tester.SetAllocatedOptionalMessageFieldsToNullViaReflection(
      to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);
}